

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O3

bool comparesEqual(QJsonArray *lhs,QJsonArray *rhs)

{
  QCborContainerPrivate *pQVar1;
  long lVar2;
  bool bVar3;
  QCborContainerPrivate *this;
  ulong idx;
  long in_FS_OFFSET;
  QCborValue QStack_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (rhs->a).d.ptr;
  this = (lhs->a).d.ptr;
  bVar3 = true;
  if (this != pQVar1) {
    if (this == (QCborContainerPrivate *)0x0) {
      lVar2 = (pQVar1->elements).d.size;
    }
    else {
      lVar2 = (this->elements).d.size;
      if (pQVar1 != (QCborContainerPrivate *)0x0) {
        if (lVar2 == (pQVar1->elements).d.size) {
          if (lVar2 != 0) {
            idx = 0;
            do {
              QCborContainerPrivate::valueAt(&local_50,this,idx);
              QCborContainerPrivate::valueAt(&QStack_68,(rhs->a).d.ptr,idx);
              bVar3 = comparesEqual(&local_50,&QStack_68);
              QCborValue::~QCborValue((QCborValue *)&QStack_68);
              QCborValue::~QCborValue((QCborValue *)&local_50);
              if (!bVar3) break;
              idx = idx + 1;
              this = (lhs->a).d.ptr;
            } while (idx < (ulong)(this->elements).d.size);
          }
        }
        else {
          bVar3 = false;
        }
        goto LAB_002eb283;
      }
    }
    bVar3 = lVar2 == 0;
  }
LAB_002eb283:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool comparesEqual(const QJsonArray &lhs, const QJsonArray &rhs)
{
    if (lhs.a == rhs.a)
        return true;

    if (!lhs.a)
        return !rhs.a->elements.size();
    if (!rhs.a)
        return !lhs.a->elements.size();
    if (lhs.a->elements.size() != rhs.a->elements.size())
        return false;

    for (qsizetype i = 0; i < lhs.a->elements.size(); ++i) {
        if (lhs.a->valueAt(i) != rhs.a->valueAt(i))
            return false;
    }
    return true;
}